

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

int uv_thread_create_ex(uv_thread_t *tid,uv_thread_options_t *params,_func_void_void_ptr *entry,
                       void *arg)

{
  int iVar1;
  size_t sVar2;
  size_t local_98;
  anon_union_8_2_743ac10c f;
  size_t min_stack_size;
  size_t stack_size;
  size_t pagesize;
  pthread_attr_t attr_storage;
  pthread_attr_t *attr;
  void *pvStack_28;
  int err;
  void *arg_local;
  _func_void_void_ptr *entry_local;
  uv_thread_options_t *params_local;
  uv_thread_t *tid_local;
  
  if ((params->flags & 1) == 0) {
    local_98 = 0;
  }
  else {
    local_98 = params->stack_size;
  }
  attr_storage._48_8_ = 0;
  pvStack_28 = arg;
  arg_local = entry;
  entry_local = (_func_void_void_ptr *)params;
  params_local = (uv_thread_options_t *)tid;
  if (local_98 == 0) {
    min_stack_size = uv__thread_stack_size();
  }
  else {
    iVar1 = getpagesize();
    min_stack_size = (local_98 + (long)iVar1) - 1 & ((long)iVar1 - 1U ^ 0xffffffffffffffff);
    sVar2 = uv__min_stack_size();
    if (min_stack_size < sVar2) {
      min_stack_size = sVar2;
    }
  }
  if (min_stack_size != 0) {
    attr_storage._48_8_ = &pagesize;
    iVar1 = pthread_attr_init((pthread_attr_t *)attr_storage._48_8_);
    if (iVar1 != 0) {
      abort();
    }
    iVar1 = pthread_attr_setstacksize((pthread_attr_t *)attr_storage._48_8_,min_stack_size);
    if (iVar1 != 0) {
      abort();
    }
  }
  attr._4_4_ = pthread_create((pthread_t *)params_local,(pthread_attr_t *)attr_storage._48_8_,
                              (__start_routine *)arg_local,pvStack_28);
  if (attr_storage._48_8_ != 0) {
    pthread_attr_destroy((pthread_attr_t *)attr_storage._48_8_);
  }
  return -attr._4_4_;
}

Assistant:

int uv_thread_create_ex(uv_thread_t* tid,
                        const uv_thread_options_t* params,
                        void (*entry)(void *arg),
                        void *arg) {
  int err;
  pthread_attr_t* attr;
  pthread_attr_t attr_storage;
  size_t pagesize;
  size_t stack_size;
  size_t min_stack_size;

  /* Used to squelch a -Wcast-function-type warning. */
  union {
    void (*in)(void*);
    void* (*out)(void*);
  } f;

  stack_size =
      params->flags & UV_THREAD_HAS_STACK_SIZE ? params->stack_size : 0;

  attr = NULL;
  if (stack_size == 0) {
    stack_size = uv__thread_stack_size();
  } else {
    pagesize = (size_t)getpagesize();
    /* Round up to the nearest page boundary. */
    stack_size = (stack_size + pagesize - 1) &~ (pagesize - 1);
    min_stack_size = uv__min_stack_size();
    if (stack_size < min_stack_size)
      stack_size = min_stack_size;
  }

  if (stack_size > 0) {
    attr = &attr_storage;

    if (pthread_attr_init(attr))
      abort();

    if (pthread_attr_setstacksize(attr, stack_size))
      abort();
  }

  f.in = entry;
  err = pthread_create(tid, attr, f.out, arg);

  if (attr != NULL)
    pthread_attr_destroy(attr);

  return UV__ERR(err);
}